

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

int __thiscall HashTable::Search(HashTable *this,Game *game)

{
  string *__rhs;
  bool *pbVar1;
  __type _Var2;
  int iVar3;
  int iVar4;
  long lVar5;
  int k;
  ulong uVar6;
  
  iVar3 = this->hashSize;
  lVar5 = (long)game->id % (long)iVar3;
  iVar4 = (int)lVar5;
  if (this->arrAddress[lVar5] == true) {
    while( true ) {
      iVar4 = (int)lVar5;
      lVar5 = (long)iVar4;
      if (this->arrAddress[lVar5] != true) break;
      lVar5 = (long)(int)(iVar4 + (uint)(iVar3 % 3 != 0) * 2 + 1) % (long)iVar3;
    }
  }
  if (this->games[lVar5].id == game->id) {
    __rhs = &game->manufacturer;
    _Var2 = std::operator==(&this->games[lVar5].manufacturer,__rhs);
    if ((((_Var2) && (_Var2 = std::operator==(&this->games[lVar5].date,&game->date), _Var2)) &&
        (_Var2 = std::operator==(&this->games[lVar5].genre,&game->genre), _Var2)) &&
       (_Var2 = std::operator==(&this->games[lVar5].name,&game->name), _Var2)) {
      return iVar4;
    }
    iVar3 = (int)(game->id + (uint)(this->hashSize % 3 != 0) * 2 + 1) % this->hashSize;
    game->id = iVar3;
    _Var2 = std::operator==(&this->games[iVar3].manufacturer,__rhs);
    if (((_Var2) && (_Var2 = std::operator==(&this->games[iVar3].date,&game->date), _Var2)) &&
       ((_Var2 = std::operator==(&this->games[iVar3].genre,&game->genre), _Var2 &&
        (_Var2 = std::operator==(&this->games[iVar3].name,&game->name), _Var2)))) {
      return iVar3;
    }
    iVar3 = 0;
    do {
      pbVar1 = this->arrAddress;
      uVar6 = (ulong)(uint)game->id;
      do {
        uVar6 = (long)(int)((int)uVar6 + (uint)(this->hashSize % 3 != 0) * 2 + 1) %
                (long)this->hashSize;
        iVar4 = (int)uVar6;
        uVar6 = uVar6 & 0xffffffff;
        game->id = iVar4;
      } while (pbVar1[iVar4] != false);
      _Var2 = std::operator==(&this->games[iVar4].manufacturer,__rhs);
      if (((_Var2) && (_Var2 = std::operator==(&this->games[iVar4].date,&game->date), _Var2)) &&
         ((_Var2 = std::operator==(&this->games[iVar4].genre,&game->genre), _Var2 &&
          (_Var2 = std::operator==(&this->games[iVar4].name,&game->name), _Var2)))) {
        return iVar4;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != this->hashSize);
  }
  return -1;
}

Assistant:

int Search(Game game)
        {

            int index = key_hash_func(game.id, hashSize);
            if (arrAddress[index])
            {
                while (arrAddress[index])
                {
                    index = value_hash_func(index, hashSize);
                }
            }
                if (games[index].id == game.id)
                {
                    if (games[index].manufacturer == game.manufacturer && games[index].date == game.date && games[index].genre == game.genre && games[index].name == game.name)
                    {
                        return index;
                    }
                    else
                    {
                        index = value_hash_func(game.id, hashSize);
                        if (games[index].manufacturer == game.manufacturer && games[index].date == game.date && games[index].genre == game.genre && games[index].name == game.name)
                        {
                            return index;
                        }
                        int count = 0;
                        while (true)
                        {

                            index = value_hash_func(game.id, hashSize);
                            if (arrAddress[index])
                            {
                                continue;
                            }
                            else
                            {
                                count++;
                                if (games[index].manufacturer == game.manufacturer && games[index].date == game.date && games[index].genre == game.genre && games[index].name == game.name)
                                {
                                    return index;
                                }
                            }
                            if (count == hashSize)
                            {
                                break;
                            }
                        }

                    }
                }

            return -1;
        }